

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindow::changeEvent(QMdiSubWindow *this,QEvent *changeEvent)

{
  QFlagsStorage<Qt::WindowState> _t1;
  QMdiSubWindowPrivate *this_00;
  QWidgetData *pQVar1;
  Representation RVar2;
  Representation RVar3;
  Representation RVar4;
  char cVar5;
  QFlagsStorageHelper<Qt::WindowState,_4> QVar6;
  WindowStates _t2;
  
  if ((*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) == 0) ||
     (*(short *)(changeEvent + 8) != 0x69)) {
    QWidget::changeEvent(&this->super_QWidget,changeEvent);
    return;
  }
  cVar5 = QWindowStateChangeEvent::isOverride();
  if (cVar5 == '\0') {
    _t1.i = *(Int *)(changeEvent + 0x10);
    QVar6.super_QFlagsStorage<Qt::WindowState>.i =
         (QFlagsStorage<Qt::WindowState>)QWidget::windowState(&this->super_QWidget);
    if ((QFlagsStorage<Qt::WindowState>)_t1.i != QVar6.super_QFlagsStorage<Qt::WindowState>.i) {
      this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
      if ((((this->super_QWidget).data)->widget_attributes & 0x8000) == 0) {
        QMdiSubWindowPrivate::ensureWindowState(this_00,WindowNoState);
        (**(code **)(*(long *)&this->super_QWidget + 0x68))(this,1);
      }
      if (((this_00->oldGeometry).x2.m_i < (this_00->oldGeometry).x1.m_i) ||
         ((this_00->oldGeometry).y2.m_i < (this_00->oldGeometry).y1.m_i)) {
        pQVar1 = (this->super_QWidget).data;
        RVar2.m_i = (pQVar1->crect).y1.m_i;
        RVar3.m_i = (pQVar1->crect).x2.m_i;
        RVar4.m_i = (pQVar1->crect).y2.m_i;
        (this_00->oldGeometry).x1 = (Representation)(pQVar1->crect).x1.m_i;
        (this_00->oldGeometry).y1 = (Representation)RVar2.m_i;
        (this_00->oldGeometry).x2 = (Representation)RVar3.m_i;
        (this_00->oldGeometry).y2 = (Representation)RVar4.m_i;
      }
      if (((uint)QVar6.super_QFlagsStorage<Qt::WindowState>.i & _t1.i & 8) != 0) {
        this_00->currentOperation = None;
      }
      if (((uint)QVar6.super_QFlagsStorage<Qt::WindowState>.i & 1) == 0 || (_t1.i & 1) != 0) {
        if (((uint)QVar6.super_QFlagsStorage<Qt::WindowState>.i & 2) == 0 ||
            (char)((_t1.i & 2) >> 1) != '\0') {
          if (((uint)QVar6.super_QFlagsStorage<Qt::WindowState>.i & 7) == 0) {
            QMdiSubWindowPrivate::setNormalMode(this_00);
          }
        }
        else {
          QMdiSubWindowPrivate::setMaximizeMode(this_00);
        }
      }
      else {
        QMdiSubWindowPrivate::setMinimizeMode(this_00);
      }
      if (this_00->isActive == true) {
        QMdiSubWindowPrivate::ensureWindowState(this_00,WindowActive);
      }
      if (this_00->activationEnabled != true) {
        return;
      }
      _t2 = QWidget::windowState(&this->super_QWidget);
      windowStateChanged(this,(WindowStates)_t1.i,_t2);
      return;
    }
  }
  changeEvent[0xc] = (QEvent)0x0;
  return;
}

Assistant:

void QMdiSubWindow::changeEvent(QEvent *changeEvent)
{
    if (!parent()) {
        QWidget::changeEvent(changeEvent);
        return;
    }

    if (changeEvent->type() != QEvent::WindowStateChange) {
        QWidget::changeEvent(changeEvent);
        return;
    }

    QWindowStateChangeEvent *event = static_cast<QWindowStateChangeEvent *>(changeEvent);
    if (event->isOverride()) {
        event->ignore();
        return;
    }

    Qt::WindowStates oldState = event->oldState();
    Qt::WindowStates newState = windowState();
    if (oldState == newState) {
        changeEvent->ignore();
        return;
    }

    // QWidget ensures that the widget is visible _after_ setWindowState(),
    // but we need to ensure that the widget is visible _before_
    // setWindowState() returns.
    Q_D(QMdiSubWindow);
    if (!isVisible()) {
        d->ensureWindowState(Qt::WindowNoState);
        setVisible(true);
    }

    if (!d->oldGeometry.isValid())
        d->oldGeometry = geometry();

    if ((oldState & Qt::WindowActive) && (newState & Qt::WindowActive))
        d->currentOperation = QMdiSubWindowPrivate::None;

    if (!(oldState & Qt::WindowMinimized) && (newState & Qt::WindowMinimized))
        d->setMinimizeMode();
    else if (!(oldState & Qt::WindowMaximized) && (newState & Qt::WindowMaximized))
        d->setMaximizeMode();
    else if (!(newState & (Qt::WindowMaximized | Qt::WindowMinimized | Qt::WindowFullScreen)))
        d->setNormalMode();

    if (d->isActive)
        d->ensureWindowState(Qt::WindowActive);
    if (d->activationEnabled)
        emit windowStateChanged(oldState, windowState());
}